

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkt-proc-builder.cpp
# Opt level: O2

unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>
__thiscall
yactfr::internal::PktProcBuilder::_buildDsPktProc(PktProcBuilder *this,DataStreamType *dst)

{
  _Rb_tree_node_base *p_Var1;
  long in_RDX;
  unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_> erProc;
  unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_> local_38;
  
  std::make_unique<yactfr::internal::DsPktProc,yactfr::DataStreamType_const&>
            ((DataStreamType *)this);
  _buildReadScopeInstr
            ((PktProcBuilder *)dst,PacketContext,*(DataType **)(in_RDX + 0xe8),
             (Proc *)(this->_traceType + 1));
  _buildReadScopeInstr
            ((PktProcBuilder *)dst,EventRecordHeader,*(DataType **)(in_RDX + 0xf0),
             (Proc *)(this->_traceType + 7));
  _buildReadScopeInstr
            ((PktProcBuilder *)dst,EventRecordCommonContext,*(DataType **)(in_RDX + 0xf8),
             (Proc *)(this->_traceType + 7));
  p_Var1 = *(_Rb_tree_node_base **)(in_RDX + 0x98);
  while( true ) {
    if (p_Var1 == (_Rb_tree_node_base *)(in_RDX + 0x88)) {
      return (__uniq_ptr_data<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>,_true,_true>
              )(__uniq_ptr_data<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>,_true,_true>
                )this;
    }
    _buildErProc((PktProcBuilder *)&erProc,(EventRecordType *)dst);
    if ((__uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>)
        erProc._M_t.
        super___uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
        ._M_t.
        super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
        .super__Head_base<0UL,_yactfr::internal::ErProc_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>)
        0x0) break;
    local_38 = (unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
               )(unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
                 )erProc._M_t.
                  super___uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
                  .super__Head_base<0UL,_yactfr::internal::ErProc_*,_false>._M_head_impl;
    erProc._M_t.
    super___uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>.
    _M_t.
    super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
    .super__Head_base<0UL,_yactfr::internal::ErProc_*,_false>._M_head_impl =
         (__uniq_ptr_data<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>,_true,_true>
          )(__uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
            )0x0;
    DsPktProc::addErProc((DsPktProc *)this->_traceType,&local_38);
    std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>::
    ~unique_ptr(&local_38);
    std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>::
    ~unique_ptr(&erProc);
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  }
  __assert_fail("erProc",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/pkt-proc-builder.cpp"
                ,0x360,
                "std::unique_ptr<DsPktProc> yactfr::internal::PktProcBuilder::_buildDsPktProc(const DataStreamType &)"
               );
}

Assistant:

std::unique_ptr<DsPktProc> PktProcBuilder::_buildDsPktProc(const DataStreamType& dst)
{
    auto dsPktProc = std::make_unique<DsPktProc>(dst);

    this->_buildReadScopeInstr(Scope::PacketContext, dst.packetContextType(),
                               dsPktProc->pktPreambleProc());
    this->_buildReadScopeInstr(Scope::EventRecordHeader, dst.eventRecordHeaderType(),
                               dsPktProc->erPreambleProc());
    this->_buildReadScopeInstr(Scope::EventRecordCommonContext,
                               dst.eventRecordCommonContextType(), dsPktProc->erPreambleProc());

    for (auto& ert : dst.eventRecordTypes()) {
        auto erProc = this->_buildErProc(*ert);

        assert(erProc);
        dsPktProc->addErProc(std::move(erProc));
    }

    return dsPktProc;
}